

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O0

void __thiscall
net_tests::anon_unknown_17::V2TransportTester::SendVersion
          (V2TransportTester *this,Span<const_unsigned_char> version_data,bool vers_ignore)

{
  long lVar1;
  byte bVar2;
  byte in_CL;
  V2TransportTester *in_RDX;
  undefined8 in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  undefined1 in_stack_00000030 [16];
  Span<const_unsigned_char> in_stack_00000040;
  Span<const_unsigned_char> aad;
  Span<const_unsigned_char> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 ignore;
  
  ignore = (undefined1)((ulong)in_RSI >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_CL & 1;
  Span<const_unsigned_char>::Span(in_stack_ffffffffffffff88);
  if (((ulong)in_RDI[0x62].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_finish & 1) == 0) {
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)CONCAT17(bVar2,in_stack_ffffffffffffff98),in_RDI,
               in_stack_ffffffffffffff88);
  }
  SendPacket(in_RDX,in_stack_00000040,(Span<const_unsigned_char>)in_stack_00000030,(bool)ignore);
  *(undefined1 *)
   &in_RDI[0x62].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SendVersion(Span<const uint8_t> version_data = {}, bool vers_ignore = false)
    {
        Span<const std::uint8_t> aad;
        // Set AAD to garbage only for first packet.
        if (!m_sent_aad) aad = m_sent_garbage;
        SendPacket(/*content=*/version_data, /*aad=*/aad, /*ignore=*/vers_ignore);
        m_sent_aad = true;
    }